

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

art_iterator_t * art_init_iterator(art_t *art,_Bool first)

{
  art_t *in_RSI;
  art_iterator_t *in_RDI;
  art_iterator_t *iterator;
  art_iterator_t *in_stack_00000028;
  art_ref_t in_stack_00000030;
  
  memset(in_RDI,0,0x90);
  in_RDI->art = in_RSI;
  if (in_RSI->root != 0) {
    art_node_init_iterator(in_stack_00000030,in_stack_00000028,art._7_1_);
  }
  return in_RDI;
}

Assistant:

art_iterator_t art_init_iterator(art_t *art, bool first) {
    art_iterator_t iterator = CROARING_ZERO_INITIALIZER;
    iterator.art = art;
    if (art->root == CROARING_ART_NULL_REF) {
        return iterator;
    }
    art_node_init_iterator(art->root, &iterator, first);
    return iterator;
}